

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktClippingTests.cpp
# Opt level: O1

int vkt::clipping::anon_unknown_0::countPixels
              (ConstPixelBufferAccess *pixels,IVec2 *regionOffset,IVec2 *regionSize,Vec4 *color,
              Vec4 *colorThreshold)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  int i;
  int iVar9;
  long lVar10;
  int iVar11;
  int y;
  int z;
  uint uVar12;
  int y_00;
  int iVar14;
  Vec4 maxColor;
  Vec4 minColor;
  float local_68 [10];
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  uint uVar13;
  
  local_68[4] = 0.0;
  local_68[5] = 0.0;
  local_68[6] = 0.0;
  local_68[7] = 0.0;
  lVar10 = 0;
  do {
    local_68[lVar10 + 4] = color->m_data[lVar10] - colorThreshold->m_data[lVar10];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_68[2] = 0.0;
  local_68[3] = 0.0;
  lVar10 = 0;
  do {
    local_68[lVar10] = color->m_data[lVar10] + colorThreshold->m_data[lVar10];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  z = regionOffset->m_data[1];
  iVar9 = regionSize->m_data[1] + z;
  iVar14 = 0;
  if (z < iVar9) {
    iVar11 = regionSize->m_data[0] + regionOffset->m_data[0];
    fVar5 = local_68[4];
    fVar6 = local_68[5];
    fVar1 = local_68[0];
    fVar2 = local_68[1];
    fVar7 = local_68[6];
    fVar3 = local_68[2];
    fVar8 = local_68[7];
    iVar14 = 0;
    fVar4 = local_68[3];
    do {
      y_00 = regionOffset->m_data[0];
      if (y_00 < iVar11) {
        do {
          uVar12 = 0;
          uVar13 = 0;
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&local_40,(int)pixels,y_00,z);
          if ((((fVar5 <= local_40) && (local_40 <= fVar1)) && (fVar6 <= local_3c)) &&
             (((uVar12 = uVar13, local_3c <= fVar2 && (fVar7 <= local_38)) &&
              ((local_38 <= fVar3 && (fVar8 <= local_34)))))) {
            uVar12 = (uint)(local_34 <= fVar4);
          }
          iVar14 = iVar14 + uVar12;
          y_00 = y_00 + 1;
        } while (iVar11 != y_00);
      }
      z = z + 1;
    } while (z != iVar9);
  }
  return iVar14;
}

Assistant:

int countPixels (const tcu::ConstPixelBufferAccess pixels, const IVec2& regionOffset, const IVec2& regionSize, const Vec4& color, const Vec4& colorThreshold)
{
	const Vec4	minColor	= color - colorThreshold;
	const Vec4	maxColor	= color + colorThreshold;
	const int	xEnd		= regionOffset.x() + regionSize.x();
	const int	yEnd		= regionOffset.y() + regionSize.y();
	int			numPixels	= 0;

	DE_ASSERT(xEnd <= pixels.getWidth());
	DE_ASSERT(yEnd <= pixels.getHeight());

	for (int y = regionOffset.y(); y < yEnd; ++y)
	for (int x = regionOffset.x(); x < xEnd; ++x)
	{
		if (isColorInRange(pixels.getPixel(x, y), minColor, maxColor))
			++numPixels;
	}

	return numPixels;
}